

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags.h
# Opt level: O2

ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger> * __thiscall
AutoArgParse::ComplexFlag<AutoArgParse::DoNothingTrigger>::makeExclusiveGroup
          (ComplexFlag<AutoArgParse::DoNothingTrigger> *this,Policy policy)

{
  ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger> *pEVar1;
  __uniq_ptr_data<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>,_true,_true>
  this_00;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_false,_true>,_bool>
  pVar2;
  string randomName;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::to_string(&local_60.first,(this->store).flags._M_h._M_element_count);
  std::operator+(&local_38,&local_60.first,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 RANDOM_STRING_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_60);
  this_00.
  super___uniq_ptr_impl<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>._M_t.
  super__Tuple_impl<0UL,_AutoArgParse::FlagBase_*,_std::default_delete<AutoArgParse::FlagBase>_>.
  super__Head_base<0UL,_AutoArgParse::FlagBase_*,_false>._M_head_impl =
       (__uniq_ptr_impl<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>)
       operator_new(0x90);
  ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger>::ExclusiveFlagGroup
            ((ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger> *)
             this_00.
             super___uniq_ptr_impl<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>
             ._M_t.
             super__Tuple_impl<0UL,_AutoArgParse::FlagBase_*,_std::default_delete<AutoArgParse::FlagBase>_>
             .super__Head_base<0UL,_AutoArgParse::FlagBase_*,_false>._M_head_impl,this,policy);
  std::__cxx11::string::string((string *)&local_60,(string *)&local_38);
  local_60.second._M_t.
  super___uniq_ptr_impl<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>._M_t.
  super__Tuple_impl<0UL,_AutoArgParse::FlagBase_*,_std::default_delete<AutoArgParse::FlagBase>_>.
  super__Head_base<0UL,_AutoArgParse::FlagBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>,_true,_true>
        )(__uniq_ptr_data<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>,_true,_true>
          )this_00.
           super___uniq_ptr_impl<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>
           ._M_t.
           super__Tuple_impl<0UL,_AutoArgParse::FlagBase_*,_std::default_delete<AutoArgParse::FlagBase>_>
           .super__Head_base<0UL,_AutoArgParse::FlagBase_*,_false>._M_head_impl;
  pVar2 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<AutoArgParse::FlagBase,std::default_delete<AutoArgParse::FlagBase>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<AutoArgParse::FlagBase,std::default_delete<AutoArgParse::FlagBase>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::pair<std::__cxx11::string,std::unique_ptr<AutoArgParse::FlagBase,std::default_delete<AutoArgParse::FlagBase>>>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<AutoArgParse::FlagBase,std::default_delete<AutoArgParse::FlagBase>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<AutoArgParse::FlagBase,std::default_delete<AutoArgParse::FlagBase>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&(this->store).flags);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>
  ::~pair(&local_60);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->store).flagInsertionOrder,&local_38);
  pEVar1 = *(ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger> **)
            ((long)pVar2.first.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
                   ._M_cur.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
            + 0x28);
  std::__cxx11::string::~string((string *)&local_38);
  return pEVar1;
}

Assistant:

inline ExclusiveFlagGroup<T>& ComplexFlag<T>::makeExclusiveGroup(
    Policy policy) {
    std::string randomName = std::to_string(store.flags.size()) + RANDOM_STRING;
    auto flagIter = store.flags.insert(std::make_pair(
        randomName,
        std::unique_ptr<FlagBase>(new ExclusiveFlagGroup<T>(*this, policy))));
    store.flagInsertionOrder.push_back(randomName);
    return *(static_cast<ExclusiveFlagGroup<T>*>(flagIter.first->second.get()));
}